

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

DBErrors __thiscall wallet::WalletBatch::LoadWallet(WalletBatch *this,CWallet *pwallet)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  DBErrors DVar13;
  LegacyDataSPKM *this_00;
  _Rb_tree_node_base *p_Var14;
  LegacyScriptPubKeyMan *this_01;
  void *pvVar15;
  LoadResult LVar16;
  LoadResult LVar17;
  LoadResult LVar18;
  iterator iVar19;
  undefined8 uVar20;
  key_type *__k;
  unsigned_long *value;
  long lVar21;
  ulong uVar22;
  DBErrors DVar23;
  DBErrors DVar24;
  long *plVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int last_client;
  vector<uint256,_std::allocator<uint256>_> upgraded_txs;
  bool any_unordered;
  LoadResult keymeta_res;
  int num_ckeys;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  LoadResult ckey_res;
  LoadResult key_res;
  DataStream prefix;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  int nMinVersion;
  LoadResult desc_res;
  int local_22c;
  undefined1 local_228 [16];
  long local_218;
  char local_209;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  undefined1 local_158 [24];
  LoadResult local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  LoadResult local_f8;
  LoadResult local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  unique_lock<std::recursive_mutex> local_c8;
  unique_lock<std::recursive_mutex> local_b8;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [8];
  undefined1 local_98 [16];
  _Rb_tree_node_base *local_88;
  size_t local_80;
  undefined1 auStack_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Base_ptr local_48;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_209 = '\0';
  local_228 = (undefined1  [16])0x0;
  local_218 = 0;
  local_c8._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_c8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_c8);
  local_22c = 0x46c6c;
  bVar9 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::VERSION_abi_cxx11_,&local_22c);
  local_a8._0_4_ = CWallet::GetVersion(pwallet);
  CWallet::WalletLogPrintf<int,int>
            (pwallet,(ConstevalFormatString<2U>)0x4a550c,(int *)local_a8,&local_22c);
  auVar6._12_4_ = 0;
  auVar6._0_12_ = stack0xffffffffffffff5c;
  _local_a8 = (_Any_data)(auVar6 << 0x20);
  bVar10 = DatabaseBatch::Read<std::__cxx11::string,int>
                     ((this->m_batch)._M_t.
                      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                      .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &DBKeys::MINVERSION_abi_cxx11_,(int *)local_a8);
  DVar13 = LOAD_OK;
  bVar11 = true;
  if (bVar10) {
    DVar13 = LOAD_OK;
    if ((int)local_a8._0_4_ < 0x297ad) {
      pwallet->nWalletVersion = local_a8._0_4_;
    }
    else {
      DVar13 = TOO_NEW;
      bVar11 = false;
    }
  }
  if (bVar11) {
    value = (unsigned_long *)local_a8;
    bVar10 = DatabaseBatch::Read<std::__cxx11::string,unsigned_long>
                       ((this->m_batch)._M_t.
                        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &DBKeys::FLAGS_abi_cxx11_,value);
    DVar13 = LOAD_OK;
    bVar11 = true;
    if (bVar10) {
      bVar10 = CWallet::LoadWalletFlags(pwallet,(uint64_t)local_a8);
      if (!bVar10) {
        CWallet::WalletLogPrintf<>(pwallet,(ConstevalFormatString<0U>)0x4a56cd);
        DVar13 = TOO_NEW;
        bVar11 = false;
      }
    }
    iVar12 = local_22c;
    if (bVar11) {
      _Var3._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      bVar11 = CWallet::IsWalletFlagSet(pwallet,0x400000000);
      if (bVar11) {
        plVar25 = (long *)(DBKeys::LEGACY_TYPES_abi_cxx11_ + 0x10);
        do {
          plVar25 = (long *)*plVar25;
          if (plVar25 == (long *)0x0) {
            DVar24 = LOAD_OK;
            break;
          }
          local_98 = (undefined1  [16])0x0;
          _local_a8 = (_Any_data)0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          Serialize<DataStream,char>
                    ((DataStream *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar25 + 1));
          (*(_Var3._M_head_impl)->_vptr_DatabaseBatch[10])
                    (&local_118,_Var3._M_head_impl,(_Invoker_type)(local_e8._0_8_ + local_d8._8_8_),
                     local_e8._8_8_ - (long)(local_e8._0_8_ + local_d8._8_8_));
          if ((long *)local_118._M_unused._0_8_ == (long *)0x0) {
            CWallet::WalletLogPrintf<std::__cxx11::string>
                      (pwallet,(ConstevalFormatString<1U>)0x4a5736,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar25 + 1));
            value = (unsigned_long *)0x9;
LAB_001ace9d:
            bVar11 = false;
          }
          else {
            iVar12 = (**(code **)(*local_118._M_unused._M_object + 0x10))
                               (local_118._M_unused._M_object,
                                (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                                local_a8,(_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                          *)local_68);
            bVar11 = iVar12 == 2;
            if (!bVar11) {
              CWallet::WalletLogPrintf<std::__cxx11::string>
                        (pwallet,(ConstevalFormatString<1U>)0x4a5766,&pwallet->m_name);
              value = (unsigned_long *)&DAT_00000008;
              goto LAB_001ace9d;
            }
          }
          DVar24 = (DBErrors)value;
          if ((long *)local_118._M_unused._0_8_ != (long *)0x0) {
            (**(code **)(*local_118._M_unused._M_object + 8))();
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_e8);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_68);
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_a8);
        } while (bVar11);
      }
      else {
        local_68 = (undefined1  [16])0x0;
        local_58._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
             ::_M_invoke;
        local_58._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
             ::_M_manager;
        LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::HDCHAIN_abi_cxx11_,
                             (LoadFunc *)local_68);
        if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_58._0_8_)(local_68,local_68,3);
        }
        local_e8 = (undefined1  [16])0x0;
        local_d8._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
             ::_M_invoke;
        local_d8._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
             ::_M_manager;
        local_f0 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::KEY_abi_cxx11_,
                               (LoadFunc *)local_e8);
        if ((_Manager_type)local_d8._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_d8._0_8_)((_Any_data *)local_e8,(_Any_data *)local_e8,__destroy_functor);
        }
        DVar23 = local_f0.m_result;
        if ((int)local_f0.m_result < (int)LVar16.m_result) {
          DVar23 = LVar16.m_result;
        }
        local_118 = (_Any_data)0x0;
        local_100 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                    ::_M_invoke;
        local_108 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                    ::_M_manager;
        local_f8 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_,
                               (LoadFunc *)&local_118);
        if (local_108 != (code *)0x0) {
          (*local_108)(&local_118,&local_118,__destroy_functor);
        }
        DVar24 = local_f8.m_result;
        if ((int)local_f8.m_result < (int)DVar23) {
          DVar24 = DVar23;
        }
        local_138 = (_Any_data)0x0;
        local_120 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                    ::_M_invoke;
        local_128 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                    ::_M_manager;
        LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::CSCRIPT_abi_cxx11_,
                             (LoadFunc *)&local_138);
        if (local_128 != (code *)0x0) {
          (*local_128)(&local_138,&local_138,__destroy_functor);
        }
        DVar23 = LVar16.m_result;
        if ((int)LVar16.m_result < (int)DVar24) {
          DVar23 = DVar24;
        }
        DVar24 = LOAD_OK;
        if (0 < (int)DVar23) {
          DVar24 = DVar23;
        }
        if ((0 < local_f8.m_records) &&
           (((iVar12 == 50000 || (iVar12 == 40000)) && (DVar24 = NEED_REWRITE, 2 < (int)DVar23)))) {
          DVar24 = DVar23;
        }
        auStack_a0._0_4_ = 0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (_Rb_tree_node_base *)auStack_a0;
        local_98 = auVar7 << 0x40;
        local_80 = 0;
        local_168._8_8_ = 0;
        local_168._M_unused._M_member_pointer = (offset_in__Undefined_class_to_subr)value;
        local_158._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
             ::_M_invoke;
        local_158._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
             ::_M_manager;
        local_88 = (_Rb_tree_node_base *)auStack_a0;
        local_140 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::KEYMETA_abi_cxx11_,
                                (LoadFunc *)&local_168);
        if ((code *)local_158._0_8_ != (code *)0x0) {
          (*(code *)local_158._0_8_)(&local_168,&local_168,__destroy_functor);
        }
        DVar23 = local_140.m_result;
        if ((int)local_140.m_result < (int)DVar24) {
          DVar23 = DVar24;
        }
        if (local_80 != 0) {
          this_00 = CWallet::GetLegacyDataSPKM(pwallet);
          if (this_00 == (LegacyDataSPKM *)0x0) {
            DVar23 = CORRUPT;
            CWallet::WalletLogPrintf<>(pwallet,(ConstevalFormatString<0U>)0x4a57f0);
          }
          else {
            for (p_Var14 = (_Rb_tree_node_base *)local_98._8_8_;
                p_Var14 != (_Rb_tree_node_base *)auStack_a0;
                p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
              auVar26[0] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0] == (char)p_Var14[1]._M_color);
              auVar26[1] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[1] == *(byte *)((long)&p_Var14[1]._M_color + 1));
              auVar26[2] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[2] == *(byte *)((long)&p_Var14[1]._M_color + 2));
              auVar26[3] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[3] == *(byte *)((long)&p_Var14[1]._M_color + 3));
              auVar26[4] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[4] == p_Var14[1].field_0x4);
              auVar26[5] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[5] == p_Var14[1].field_0x5);
              auVar26[6] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[6] == p_Var14[1].field_0x6);
              auVar26[7] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[7] == p_Var14[1].field_0x7);
              auVar26[8] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[8] == *(uchar *)&p_Var14[1]._M_parent);
              auVar26[9] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[9] == *(uchar *)((long)&p_Var14[1]._M_parent + 1));
              auVar26[10] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                              m_data._M_elems[10] == *(uchar *)((long)&p_Var14[1]._M_parent + 2));
              auVar26[0xb] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xb] == *(uchar *)((long)&p_Var14[1]._M_parent + 3));
              auVar26[0xc] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xc] == *(uchar *)((long)&p_Var14[1]._M_parent + 4));
              auVar26[0xd] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xd] == *(uchar *)((long)&p_Var14[1]._M_parent + 5));
              auVar26[0xe] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xe] == *(uchar *)((long)&p_Var14[1]._M_parent + 6));
              auVar26[0xf] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                               m_data._M_elems[0xf] == *(uchar *)((long)&p_Var14[1]._M_parent + 7));
              uVar1 = *(undefined4 *)&p_Var14[1]._M_left;
              uVar2 = *(undefined4 *)
                       ((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                        _M_elems + 0x10);
              auVar27[0] = -((char)uVar2 == (char)uVar1);
              auVar27[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
              auVar27[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
              auVar27[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
              auVar27[4] = 0xff;
              auVar27[5] = 0xff;
              auVar27[6] = 0xff;
              auVar27[7] = 0xff;
              auVar27[8] = 0xff;
              auVar27[9] = 0xff;
              auVar27[10] = 0xff;
              auVar27[0xb] = 0xff;
              auVar27[0xc] = 0xff;
              auVar27[0xd] = 0xff;
              auVar27[0xe] = 0xff;
              auVar27[0xf] = 0xff;
              auVar27 = auVar27 & auVar26;
              if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) {
                LegacyDataSPKM::AddInactiveHDChain(this_00,(CHDChain *)&p_Var14[1]._M_right);
              }
            }
          }
        }
        local_188 = (_Any_data)0x0;
        local_170 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_invoke;
        local_178 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                    ::_M_manager;
        LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::WATCHS_abi_cxx11_,
                             (LoadFunc *)&local_188);
        if (local_178 != (code *)0x0) {
          (*local_178)(&local_188,&local_188,__destroy_functor);
        }
        if ((int)DVar23 <= (int)LVar16.m_result) {
          DVar23 = LVar16.m_result;
        }
        local_1a8 = (_Any_data)0x0;
        local_190 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_invoke;
        local_198 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                    ::_M_manager;
        LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::WATCHMETA_abi_cxx11_,
                             (LoadFunc *)&local_1a8);
        if (local_198 != (code *)0x0) {
          (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
        }
        if ((int)DVar23 <= (int)LVar17.m_result) {
          DVar23 = LVar17.m_result;
        }
        local_1c8 = (_Any_data)0x0;
        local_1b0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_invoke;
        local_1b8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                    ::_M_manager;
        LVar18 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::POOL_abi_cxx11_,
                             (LoadFunc *)&local_1c8);
        if (local_1b8 != (code *)0x0) {
          (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
        }
        DVar24 = LVar18.m_result;
        if ((int)LVar18.m_result < (int)DVar23) {
          DVar24 = DVar23;
        }
        local_1e8 = (_Any_data)0x0;
        local_1d0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_invoke;
        local_1d8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                    ::_M_manager;
        LVar18 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::DEFAULTKEY_abi_cxx11_,
                             (LoadFunc *)&local_1e8);
        if (local_1d8 != (code *)0x0) {
          (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
        }
        DVar23 = LVar18.m_result;
        if ((int)LVar18.m_result < (int)DVar24) {
          DVar23 = DVar24;
        }
        local_208 = (_Any_data)0x0;
        local_1f0 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_invoke;
        local_1f8 = std::
                    _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                    ::_M_manager;
        LVar18 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::OLD_KEY_abi_cxx11_,
                             (LoadFunc *)&local_208);
        if (local_1f8 != (code *)0x0) {
          (*local_1f8)(&local_208,&local_208,__destroy_functor);
        }
        DVar24 = LVar18.m_result;
        if ((int)LVar18.m_result < (int)DVar23) {
          DVar24 = DVar23;
        }
        if ((int)DVar24 < 5) {
          local_b8._M_device =
               (mutex_type *)
               CONCAT44(local_b8._M_device._4_4_,local_f8.m_records + local_f0.m_records);
          CWallet::WalletLogPrintf<int,int,int,int>
                    (pwallet,(ConstevalFormatString<4U>)0x4a5828,&local_f0.m_records,
                     &local_f8.m_records,&local_140.m_records,(int *)&local_b8);
          bVar11 = CWallet::IsLegacy(pwallet);
          if (bVar11) {
            if ((LVar16.m_records + local_f0.m_records + local_f8.m_records !=
                 LVar17.m_records + local_140.m_records) &&
               (this_01 = CWallet::GetLegacyScriptPubKeyMan(pwallet),
               this_01 != (LegacyScriptPubKeyMan *)0x0)) {
              local_b8._M_device =
                   &(this_01->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.
                    super_recursive_mutex;
              local_b8._M_owns = false;
              std::unique_lock<std::recursive_mutex>::lock(&local_b8);
              LegacyScriptPubKeyMan::UpdateTimeFirstKey(this_01,1);
              std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
            }
          }
        }
        std::
        _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
        ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                     *)local_a8);
      }
      if ((int)DVar13 < (int)DVar24) {
        DVar13 = DVar24;
      }
      _Var3._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      local_e8._0_4_ = local_22c;
      auVar4._12_4_ = 0;
      auVar4._0_12_ = local_118._4_12_;
      local_118 = (_Any_data)(auVar4 << 0x20);
      auVar5._12_4_ = 0;
      auVar5._0_12_ = local_138._4_12_;
      local_138 = (_Any_data)(auVar5 << 0x20);
      _local_a8 = (_Any_data)0x0;
      local_98 = (undefined1  [16])0x0;
      pvVar15 = operator_new(0x20);
      *(DatabaseBatch **)pvVar15 = _Var3._M_head_impl;
      *(_Any_data **)((long)pvVar15 + 8) = &local_118;
      *(_Any_data **)((long)pvVar15 + 0x10) = &local_138;
      *(undefined1 **)((long)pvVar15 + 0x18) = local_e8;
      local_a8 = (undefined1  [8])pvVar15;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
           ::_M_manager;
      LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::WALLETDESCRIPTOR_abi_cxx11_
                           ,(LoadFunc *)local_a8);
      local_68._0_4_ = LVar16.m_result;
      local_68._4_4_ = LVar16.m_records;
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      if ((int)local_68._0_4_ < 5) {
        local_168._0_4_ = local_138._0_4_ + local_118._0_4_;
        CWallet::WalletLogPrintf<int,int,int,int>
                  (pwallet,(ConstevalFormatString<4U>)0x4a5c55,(int *)(local_68 + 4),
                   (int *)local_118._M_pod_data,(int *)local_138._M_pod_data,
                   (int *)local_168._M_pod_data);
      }
      DVar23 = DVar13;
      if ((int)DVar13 < (int)local_68._0_4_) {
        DVar23 = local_68._0_4_;
      }
      DVar13 = UNKNOWN_DESCRIPTOR;
      if (DVar23 != UNKNOWN_DESCRIPTOR) {
        _Var3._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        _local_a8 = (_Any_data)0x0;
        local_98._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_invoke;
        local_98._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
             ::_M_manager;
        LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::NAME_abi_cxx11_,
                             (LoadFunc *)local_a8);
        if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_98._0_8_)(local_a8,local_a8,3);
        }
        local_68 = (undefined1  [16])0x0;
        local_58._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
             ::_M_invoke;
        local_58._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
             ::_M_manager;
        LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::PURPOSE_abi_cxx11_,
                             (LoadFunc *)local_68);
        if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_58._0_8_)(local_68,local_68,3);
        }
        local_e8 = (undefined1  [16])0x0;
        local_d8._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
             ::_M_invoke;
        local_d8._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
             ::_M_manager;
        LVar18 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::DESTDATA_abi_cxx11_,
                             (LoadFunc *)local_e8);
        if ((_Manager_type)local_d8._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_d8._0_8_)((_Any_data *)local_e8,(_Any_data *)local_e8,__destroy_functor);
        }
        DVar13 = LVar17.m_result;
        if ((int)LVar17.m_result < (int)LVar16.m_result) {
          DVar13 = LVar16.m_result;
        }
        if ((int)DVar13 <= (int)LVar18.m_result) {
          DVar13 = LVar18.m_result;
        }
        DVar24 = LOAD_OK;
        if (0 < (int)DVar13) {
          DVar24 = DVar13;
        }
        if (DVar24 <= DVar23) {
          DVar24 = DVar23;
        }
        _Var3._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        local_209 = '\0';
        auStack_a0 = (undefined1  [8])local_228;
        local_a8 = (undefined1  [8])&local_209;
        local_98._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_invoke;
        local_98._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
             ::_M_manager;
        LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::TX_abi_cxx11_,
                             (LoadFunc *)local_a8);
        if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_98._0_8_)(local_a8,local_a8,3);
        }
        local_68 = (undefined1  [16])0x0;
        local_58._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
             ::_M_invoke;
        local_58._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
             ::_M_manager;
        LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::LOCKED_UTXO_abi_cxx11_,
                             (LoadFunc *)local_68);
        if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_58._0_8_)(local_68,local_68,3);
        }
        local_e8 = (undefined1  [16])0x0;
        local_d8._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
             ::_M_invoke;
        local_d8._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
             ::_M_manager;
        LVar18 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::ORDERPOSNEXT_abi_cxx11_,
                             (LoadFunc *)local_e8);
        if ((_Manager_type)local_d8._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_d8._0_8_)((_Any_data *)local_e8,(_Any_data *)local_e8,__destroy_functor);
        }
        DVar13 = LVar17.m_result;
        if ((int)LVar17.m_result < (int)LVar16.m_result) {
          DVar13 = LVar16.m_result;
        }
        if ((int)DVar13 <= (int)LVar18.m_result) {
          DVar13 = LVar18.m_result;
        }
        if ((int)DVar13 < 1) {
          DVar13 = LOAD_OK;
        }
        if (DVar13 <= DVar24) {
          DVar13 = DVar24;
        }
        _Var3._M_head_impl =
             (this->m_batch)._M_t.
             super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
             .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
        local_48 = (_Base_ptr)(local_68 + 8);
        local_68._8_4_ = 0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_48;
        local_58 = auVar8 << 0x40;
        local_40 = 0;
        local_a8 = (undefined1  [8])local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_,
                   DAT_006c4010 + DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_);
        p_Var14 = (_Rb_tree_node_base *)auStack_78;
        local_88 = p_Var14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,DBKeys::ACTIVEINTERNALSPK_abi_cxx11_,
                   DAT_006c4030 + DBKeys::ACTIVEINTERNALSPK_abi_cxx11_);
        lVar21 = 0;
        DVar23 = LOAD_OK;
        do {
          local_e8._8_8_ = (string *)(local_a8 + lVar21);
          local_e8._0_8_ = local_68;
          local_d8._8_8_ =
               std::
               _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
               ::_M_invoke;
          local_d8._0_8_ =
               std::
               _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
               ::_M_manager;
          LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)(local_a8 + lVar21),
                               (LoadFunc *)local_e8);
          if ((_Manager_type)local_d8._0_8_ != (_Manager_type)0x0) {
            (*(code *)local_d8._0_8_)((_Any_data *)local_e8,(_Any_data *)local_e8,__destroy_functor)
            ;
          }
          if ((int)DVar23 <= (int)LVar16.m_result) {
            DVar23 = LVar16.m_result;
          }
          lVar21 = lVar21 + 0x20;
        } while (lVar21 != 0x40);
        lVar21 = -0x40;
        do {
          if (p_Var14 != p_Var14[-1]._M_left) {
            operator_delete(p_Var14[-1]._M_left,*(long *)p_Var14 + 1);
          }
          p_Var14 = p_Var14 + -1;
          lVar21 = lVar21 + 0x20;
        } while (lVar21 != 0);
        std::
        _Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
        ::~_Rb_tree((_Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
                     *)local_68);
        if ((int)DVar13 < (int)DVar23) {
          DVar13 = DVar23;
        }
        _local_a8 = (_Any_data)0x0;
        local_98._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_invoke;
        local_98._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
             ::_M_manager;
        LVar16 = LoadRecords(pwallet,(this->m_batch)._M_t.
                                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                     _M_head_impl,(string *)&DBKeys::MASTER_KEY_abi_cxx11_,
                             (LoadFunc *)local_a8);
        if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
          (*(code *)local_98._0_8_)(local_a8,local_a8,3);
        }
        uVar22 = (ulong)LVar16 & 0xffffffff;
        if ((int)LVar16.m_result < (int)DVar13) {
          uVar22 = (ulong)DVar13;
        }
        while (DVar13 = (DBErrors)uVar22, DVar13 == LOAD_OK) {
          uVar20 = local_228._8_8_;
          if (local_228._0_8_ == local_228._8_8_) {
LAB_001ada6e:
            if (!bVar9 || local_22c != 0x46c6c) {
              DatabaseBatch::Write<std::__cxx11::string,int>
                        ((this->m_batch)._M_t.
                         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &DBKeys::VERSION_abi_cxx11_,&CLIENT_VERSION,true);
            }
            if (local_209 == '\x01') {
              DVar13 = CWallet::ReorderTransactions(pwallet);
            }
            CWallet::UpgradeKeyMetadata(pwallet);
            CWallet::UpgradeDescriptorCache(pwallet);
            break;
          }
          __k = (key_type *)local_228._0_8_;
          while (iVar19 = std::
                          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(&(pwallet->mapWallet)._M_h,__k),
                iVar19.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur != (__node_type *)0x0) {
            WriteTx(this,(CWalletTx *)
                         ((long)iVar19.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
            __k = __k + 1;
            if (__k == (key_type *)uVar20) goto LAB_001ada6e;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001ae1e1;
          uVar20 = std::__throw_out_of_range("_Map_base::at");
          std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
          std::
          _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
          ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                       *)local_a8);
          __cxa_begin_catch(uVar20);
          __cxa_end_catch();
          uVar22 = 9;
        }
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_c8);
  if ((void *)local_228._0_8_ != (void *)0x0) {
    operator_delete((void *)local_228._0_8_,local_218 - local_228._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return DVar13;
  }
LAB_001ae1e1:
  __stack_chk_fail();
}

Assistant:

DBErrors WalletBatch::LoadWallet(CWallet* pwallet)
{
    DBErrors result = DBErrors::LOAD_OK;
    bool any_unordered = false;
    std::vector<uint256> upgraded_txs;

    LOCK(pwallet->cs_wallet);

    // Last client version to open this wallet
    int last_client = CLIENT_VERSION;
    bool has_last_client = m_batch->Read(DBKeys::VERSION, last_client);
    pwallet->WalletLogPrintf("Wallet file version = %d, last client version = %d\n", pwallet->GetVersion(), last_client);

    try {
        if ((result = LoadMinVersion(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

        // Load wallet flags, so they are known when processing other records.
        // The FLAGS key is absent during wallet creation.
        if ((result = LoadWalletFlags(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

#ifndef ENABLE_EXTERNAL_SIGNER
        if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
            pwallet->WalletLogPrintf("Error: External signer wallet being loaded without external signer support compiled\n");
            return DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED;
        }
#endif

        // Load legacy wallet keys
        result = std::max(LoadLegacyWalletRecords(pwallet, *m_batch, last_client), result);

        // Load descriptors
        result = std::max(LoadDescriptorWalletRecords(pwallet, *m_batch, last_client), result);
        // Early return if there are unknown descriptors. Later loading of ACTIVEINTERNALSPK and ACTIVEEXTERNALEXPK
        // may reference the unknown descriptor's ID which can result in a misleading corruption error
        // when in reality the wallet is simply too new.
        if (result == DBErrors::UNKNOWN_DESCRIPTOR) return result;

        // Load address book
        result = std::max(LoadAddressBookRecords(pwallet, *m_batch), result);

        // Load tx records
        result = std::max(LoadTxRecords(pwallet, *m_batch, upgraded_txs, any_unordered), result);

        // Load SPKMs
        result = std::max(LoadActiveSPKMs(pwallet, *m_batch), result);

        // Load decryption keys
        result = std::max(LoadDecryptionKeys(pwallet, *m_batch), result);
    } catch (...) {
        // Exceptions that can be ignored or treated as non-critical are handled by the individual loading functions.
        // Any uncaught exceptions will be caught here and treated as critical.
        result = DBErrors::CORRUPT;
    }

    // Any wallet corruption at all: skip any rewriting or
    // upgrading, we don't want to make it worse.
    if (result != DBErrors::LOAD_OK)
        return result;

    for (const uint256& hash : upgraded_txs)
        WriteTx(pwallet->mapWallet.at(hash));

    if (!has_last_client || last_client != CLIENT_VERSION) // Update
        m_batch->Write(DBKeys::VERSION, CLIENT_VERSION);

    if (any_unordered)
        result = pwallet->ReorderTransactions();

    // Upgrade all of the wallet keymetadata to have the hd master key id
    // This operation is not atomic, but if it fails, updated entries are still backwards compatible with older software
    try {
        pwallet->UpgradeKeyMetadata();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    // Upgrade all of the descriptor caches to cache the last hardened xpub
    // This operation is not atomic, but if it fails, only new entries are added so it is backwards compatible
    try {
        pwallet->UpgradeDescriptorCache();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    return result;
}